

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * CTcPrsOpUnary::parse_embedding(CTcEmbedBuilder *b)

{
  CTcEmbedLevel *parent;
  CTcToken *pCVar1;
  size_t sVar2;
  char *pcVar3;
  char *open_kw;
  CTcPrsNode *n;
  CTcEmbedLevel level;
  int eos;
  CTcEmbedLevel *in_stack_000000c8;
  int *in_stack_000000d0;
  CTcEmbedBuilder *in_stack_000000d8;
  char **in_stack_ffffffffffffffd0;
  CTcEmbedBuilder *in_stack_ffffffffffffffe0;
  int local_c;
  
  while( true ) {
    CTcEmbedLevel::CTcEmbedLevel((CTcEmbedLevel *)&stack0xffffffffffffffe0,0,(CTcEmbedLevel *)0x0);
    parent = (CTcEmbedLevel *)
             parse_embedding_list(in_stack_000000d8,in_stack_000000d0,in_stack_000000c8);
    if ((parent == (CTcEmbedLevel *)0x0) || (local_c != 0)) break;
    parse_embedded_end_tok(in_stack_ffffffffffffffe0,parent,in_stack_ffffffffffffffd0);
    pCVar1 = CTcTokenizer::getcur(G_tok);
    sVar2 = CTcToken::get_text_len(pCVar1);
    pCVar1 = CTcTokenizer::getcur(G_tok);
    pcVar3 = CTcToken::get_text(pCVar1);
    CTcTokenizer::log_error(0x2bdc,sVar2 & 0xffffffff,pcVar3,in_stack_ffffffffffffffd0);
  }
  return (CTcPrsNode *)parent;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_embedding(CTcEmbedBuilder *b)
{
    /* keep going until we reach the end of the string */
    for (;;)
    {
        /* parse a series of embeddings */
        int eos;
        CTcEmbedLevel level(CTcEmbedLevel::Outer, 0);
        CTcPrsNode *n = parse_embedding_list(b, eos, &level);

        /* if we encountered an error or the end of the string, we're done */
        if (n == 0 || eos)
            return n;

        /* 
         *   We stopped parsing without reaching the end of the string, so we
         *   must have encountered a token that terminates a nested structure
         *   - <<end>>, <<else>>, <<case>>, etc.  Capture the current
         *   embedding so we can check which type of end token it is.  
         */
        const char *open_kw;
        parse_embedded_end_tok(b, &level, &open_kw);
        G_tok->log_error(TCERR_BAD_EMBED_END_TOK,
                         (int)G_tok->getcur()->get_text_len(),
                         G_tok->getcur()->get_text(), open_kw);
    }
}